

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O1

MPP_RET h264d_flush(void *decoder)

{
  MPP_RET MVar1;
  char *fmt;
  undefined8 uVar2;
  
  if (decoder == (void *)0x0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    MVar1 = MPP_OK;
    uVar2 = 0x1e0;
  }
  else if (*(long *)((long)decoder + 0x38) == 0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    MVar1 = MPP_OK;
    uVar2 = 0x1e1;
  }
  else if (*(long *)((long)decoder + 0x48) == 0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    MVar1 = MPP_OK;
    uVar2 = 0x1e2;
  }
  else {
    MVar1 = output_dpb((H264_DecCtx_t *)decoder,
                       *(H264_DpbBuf_t **)(*(long *)((long)decoder + 0x48) + 0xa30));
    if (MVar1 < MPP_OK) {
      MVar1 = MPP_NOK;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_NOK;
      }
      fmt = "Function error(%d).\n";
      uVar2 = 0x1e4;
    }
    else {
      if (*(char *)((long)decoder + 0x60) == '\0') {
        return MPP_OK;
      }
      MVar1 = output_dpb((H264_DecCtx_t *)decoder,
                         *(H264_DpbBuf_t **)(*(long *)((long)decoder + 0x48) + 0xa38));
      if (MPP_NOK < MVar1) {
        return MPP_OK;
      }
      MVar1 = MPP_NOK;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_NOK;
      }
      fmt = "Function error(%d).\n";
      uVar2 = 0x1e6;
    }
  }
  _mpp_log_l(4,"h264d_api",fmt,(char *)0x0,uVar2);
  return MVar1;
}

Assistant:

MPP_RET  h264d_flush(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;

    INP_CHECK(ret, !decoder);
    INP_CHECK(ret, !p_Dec->p_Inp);
    INP_CHECK(ret, !p_Dec->p_Vid);

    FUN_CHECK(ret = output_dpb(p_Dec, p_Dec->p_Vid->p_Dpb_layer[0]));
    if (p_Dec->mvc_valid) {
        FUN_CHECK(ret = output_dpb(p_Dec, p_Dec->p_Vid->p_Dpb_layer[1]));
    }

__RETURN:
    return ret = MPP_OK;
__FAILED:
    return ret = MPP_NOK;
}